

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O0

void __thiscall Database::mapSlice(Database *this,int fd,int slice_number)

{
  void *__addr;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  void *data_mapped;
  
  __addr = mmap((void *)0x0,0x2000000,3,1,in_ESI,0);
  if (__addr != (void *)0xffffffffffffffff) {
    madvise(__addr,0x2000000,2);
    *(void **)(in_RDI + 0x4068 + (long)in_EDX * 8) = __addr;
    return;
  }
  __assert_fail("data_mapped != MAP_FAILED",
                "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/engine_race/database.cc"
                ,0x79,"void Database::mapSlice(int, int)");
}

Assistant:

void Database::mapSlice(int fd, int slice_number) {
    auto data_mapped = mmap(nullptr, SLICE_SIZE, PROT_READ | PROT_WRITE, MAP_SHARED, fd, 0);
    assert(data_mapped != MAP_FAILED);
    madvise(data_mapped, SLICE_SIZE, MADV_SEQUENTIAL);
    slices[slice_number] = (char*) data_mapped;
}